

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

TupleMake * __thiscall
wasm::Builder::makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *operands)

{
  TupleMake *pTVar1;
  MixedArena *this_00;
  
  this_00 = &this->wasm->allocator;
  pTVar1 = (TupleMake *)MixedArena::allocSpace(this_00,0x30,8);
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)57>).super_Expression._id = TupleMakeId;
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)57>).super_Expression.type.id = 0;
  (pTVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
       = (Expression **)0x0;
  (pTVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pTVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pTVar1->operands).allocator = this_00;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pTVar1->operands,
             operands);
  ::wasm::TupleMake::finalize();
  return pTVar1;
}

Assistant:

TupleMake* makeTupleMake(ListType&& operands) {
    auto* ret = wasm.allocator.alloc<TupleMake>();
    ret->operands.set(operands);
    ret->finalize();
    return ret;
  }